

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O3

value configuration_value_type(configuration config,char *key,type_id id)

{
  type_id tVar1;
  value v;
  value pvVar2;
  
  if (config == (configuration)0x0) {
    return (value)0x0;
  }
  v = configuration_object_get(config,key);
  if (v == (value)0x0) {
    pvVar2 = (value)0x0;
  }
  else {
    tVar1 = value_type_id(v);
    pvVar2 = (value)0x0;
    if (tVar1 == id) {
      pvVar2 = v;
    }
  }
  return pvVar2;
}

Assistant:

value configuration_value_type(configuration config, const char *key, type_id id)
{
	if (config == NULL)
	{
		return NULL;
	}

	value v = configuration_object_get(config, key);

	if (v == NULL)
	{
		return NULL;
	}

	if (value_type_id(v) != id)
	{
		return NULL;
	}

	return v;
}